

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O3

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::handle
          (SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs> *this,LeafData *ld,
          bool doInsert)

{
  bool bVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  int iVar4;
  TypedTermList TVar5;
  TypedTermList TVar6;
  Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  bindings;
  Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_a0;
  Clause *local_90;
  uint local_88;
  char local_84;
  ulong local_80;
  int iStack_78;
  undefined4 uStack_74;
  undefined1 uStack_70;
  undefined3 local_6f;
  undefined1 uStack_6c;
  undefined7 uStack_6b;
  undefined4 local_64;
  LeafData local_60;
  
  TVar5 = Kernel::SelectedSummand::key(&ld->super_SelectedSummand);
  TVar6._sort = TVar5._sort._content;
  TVar6.super_TermList._content = TVar6._sort._content;
  TVar6 = Kernel::Renaming::normalize((Renaming *)TVar5.super_TermList._content._content,TVar6);
  Lib::
  Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::Recycled(&local_a0);
  iVar4 = 1;
  if (1 < this->_nextVar) {
    iVar4 = this->_nextVar;
  }
  this->_nextVar = iVar4;
  Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::insert
            ((DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash> *)
             local_a0._self._M_t.
             super___uniq_ptr_impl<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_std::default_delete<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>_*,_std::default_delete<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>_>_>
             .
             super__Head_base<0UL,_Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>_*,_false>
             ._M_head_impl,0,TVar6.super_TermList._content);
  iVar4 = 2;
  if (2 < this->_nextVar) {
    iVar4 = this->_nextVar;
  }
  this->_nextVar = iVar4;
  Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::insert
            ((DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash> *)
             local_a0._self._M_t.
             super___uniq_ptr_impl<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_std::default_delete<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>_*,_std::default_delete<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>_>_>
             .
             super__Head_base<0UL,_Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>_*,_false>
             ._M_head_impl,1,(uint64_t)TVar6._sort._content);
  bVar1 = (ld->super_SelectedSummand).super_SelectedLiteral.interpreted.
          super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
          ._isSome;
  if (doInsert) {
    if (bVar1 == false) {
      local_60.super_SelectedSummand.super_SelectedLiteral._44_4_ =
           *(undefined4 *)&(ld->super_SelectedSummand).super_SelectedLiteral.field_0x2c;
      local_60.super_SelectedSummand.super_SelectedLiteral.litIdx =
           (ld->super_SelectedSummand).super_SelectedLiteral.litIdx;
      local_60.super_SelectedSummand.super_SelectedLiteral.cl =
           (ld->super_SelectedSummand).super_SelectedLiteral.cl;
    }
    else {
      uVar2 = *(undefined4 *)
               ((long)&(ld->super_SelectedSummand).super_SelectedLiteral.interpreted.
                       super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                       ._elem._elem + 0x11);
      uVar3 = *(undefined8 *)
               ((long)&(ld->super_SelectedSummand).super_SelectedLiteral.interpreted.
                       super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                       ._elem._elem + 9);
      local_60.super_SelectedSummand.super_SelectedLiteral._44_4_ =
           *(undefined4 *)&(ld->super_SelectedSummand).super_SelectedLiteral.field_0x2c;
      local_60.super_SelectedSummand.super_SelectedLiteral.litIdx =
           (ld->super_SelectedSummand).super_SelectedLiteral.litIdx;
      local_60.super_SelectedSummand.super_SelectedLiteral.cl =
           (ld->super_SelectedSummand).super_SelectedLiteral.cl;
      local_60.super_SelectedSummand.super_SelectedLiteral.interpreted.
      super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      ._elem._elem._21_7_ = 0;
      local_60.super_SelectedSummand.super_SelectedLiteral.interpreted.
      super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      ._elem._elem._0_5_ =
           *(uint5 *)&(ld->super_SelectedSummand).super_SelectedLiteral.interpreted.
                      super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                      ._elem._elem & 0xffffffff03;
      local_60.super_SelectedSummand.super_SelectedLiteral.interpreted.
      super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      ._elem._elem._5_3_ = 0;
      local_60.super_SelectedSummand.super_SelectedLiteral.interpreted.
      super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      ._elem._elem._9_3_ = (undefined3)uVar3;
      local_60.super_SelectedSummand.super_SelectedLiteral.interpreted.
      super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      ._elem._elem._8_4_ =
           (uint)(uint3)local_60.super_SelectedSummand.super_SelectedLiteral.interpreted.
                        super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                        ._elem._elem._9_3_ << 8;
      local_60.super_SelectedSummand.super_SelectedLiteral.interpreted.
      super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      ._elem._elem._12_4_ = (undefined4)((ulong)uVar3 >> 0x18);
      local_60.super_SelectedSummand.super_SelectedLiteral.interpreted.
      super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      ._elem._elem.init._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      .
      super_RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
      ._content[0xf] = (char)((ulong)uVar3 >> 0x38);
      local_60.super_SelectedSummand.super_SelectedLiteral.interpreted.
      super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      ._elem._elem._17_3_ = (undefined3)uVar2;
      local_60.super_SelectedSummand.super_SelectedLiteral.interpreted.
      super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      ._elem._elem.init._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      .
      super_RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
      ._content[0x13] = (char)((uint)uVar2 >> 0x18);
    }
    local_60.super_SelectedSummand.super_SelectedLiteral.interpreted.
    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ._isSome = bVar1;
    insert(this,(BindingMap *)
                local_a0._self._M_t.
                super___uniq_ptr_impl<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_std::default_delete<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>_*,_std::default_delete<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>_>_>
                .
                super__Head_base<0UL,_Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>_*,_false>
                ._M_head_impl,&local_60);
  }
  else {
    if (bVar1 == false) {
      local_64 = *(undefined4 *)&(ld->super_SelectedSummand).super_SelectedLiteral.field_0x2c;
      local_88 = (ld->super_SelectedSummand).super_SelectedLiteral.litIdx;
      local_90 = (ld->super_SelectedSummand).super_SelectedLiteral.cl;
    }
    else {
      uVar2 = *(undefined4 *)
               ((long)&(ld->super_SelectedSummand).super_SelectedLiteral.interpreted.
                       super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                       ._elem._elem + 0x11);
      uVar3 = *(undefined8 *)
               ((long)&(ld->super_SelectedSummand).super_SelectedLiteral.interpreted.
                       super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                       ._elem._elem + 9);
      local_64 = *(undefined4 *)&(ld->super_SelectedSummand).super_SelectedLiteral.field_0x2c;
      local_88 = (ld->super_SelectedSummand).super_SelectedLiteral.litIdx;
      local_90 = (ld->super_SelectedSummand).super_SelectedLiteral.cl;
      uStack_6b = 0;
      local_80 = (ulong)(*(uint5 *)&(ld->super_SelectedSummand).super_SelectedLiteral.interpreted.
                                    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                                    ._elem._elem & 0xffffffff03);
      iStack_78._1_3_ = (uint3)uVar3;
      iStack_78 = (uint)iStack_78._1_3_ << 8;
      uStack_74 = (undefined4)((ulong)uVar3 >> 0x18);
      uStack_70 = (undefined1)((ulong)uVar3 >> 0x38);
      local_6f = (undefined3)uVar2;
      uStack_6c = (undefined1)((uint)uVar2 >> 0x18);
    }
    local_84 = bVar1;
    remove(this,(char *)local_a0._self._M_t.
                        super___uniq_ptr_impl<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_std::default_delete<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>_*,_std::default_delete<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>_>_>
                        .
                        super__Head_base<0UL,_Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>_*,_false>
                        ._M_head_impl);
  }
  Lib::
  Recycled<Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled(&local_a0);
  return;
}

Assistant:

void handle(LeafData ld, bool doInsert)
    {
      auto norm = Renaming::normalize(ld.key());
      Recycled<BindingMap> bindings;
      createBindings(norm, /* reversed */ false,
          [&](int var, auto term) { 
            _nextVar = std::max(_nextVar, var + 1);
            bindings->insert(var, term);
          });
      if (doInsert) insert(*bindings, ld);
      else          remove(*bindings, ld);
    }